

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O1

uchar __thiscall chatra::Reader::readRawInteger<unsigned_char>(Reader *this)

{
  byte bVar1;
  pointer puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  
  checkSpace(this,1);
  uVar5 = this->offset;
  this->offset = uVar5 + 1;
  puVar2 = (this->buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)((long)(this->buffer->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    bVar8 = puVar2[uVar5];
    uVar9 = (uint)bVar8;
    if ((char)bVar8 < '\0') {
      uVar5 = (ulong)(uVar9 & 0x7f);
      uVar7 = 0;
      bVar6 = false;
      do {
        checkSpace(this,1);
        uVar3 = this->offset;
        this->offset = uVar3 + 1;
        puVar2 = (this->buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->buffer->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish - (long)puVar2) <= uVar3)
        goto LAB_00185f50;
        uVar7 = uVar7 + 7;
        bVar1 = puVar2[uVar3];
        if ((char)bVar1 < '\0') {
          uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)uVar7 & 0x3f);
        }
        else {
          uVar5 = uVar5 | (ulong)(bVar1 & 0x3f) << ((byte)uVar7 & 0x3f);
          uVar9 = (bVar1 < 0x40) - 1 ^ (uint)uVar5;
        }
        bVar8 = (byte)uVar9;
      } while (((char)bVar1 < '\0') && (bVar6 = uVar7 >= 0x39, uVar7 < 0x39));
      if (bVar6) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar4 = 0;
        puVar4[1] = 0;
        puVar4[2] = 0;
        puVar4[3] = 0;
        puVar4[4] = 0;
        puVar4[1] = puVar4 + 3;
        puVar4[2] = 0;
        *(undefined1 *)(puVar4 + 3) = 0;
        *puVar4 = &PTR__NativeException_00245b18;
        __cxa_throw(puVar4,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
      }
    }
    return bVar8;
  }
LAB_00185f50:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

Type readRawInteger() {
		checkSpace();
		auto t = static_cast<uint64_t>(buffer->at(offset++));
		if (t < 128)
			return static_cast<Type>(t);
		t &= 0x7FU;
		for (unsigned position = 7; position < 64; position += 7) {
			checkSpace();
			auto c = static_cast<uint64_t>(buffer->at(offset++));
			if (c & 0x80U)
				t |= (c & 0x7FU) << position;
			else {
				t |= (c & 0x3FU) << position;
				return static_cast<Type>(c & 0x40U ? ~t : t);
			}
		}
		throw IllegalArgumentException();
	}